

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectmodelbuilder.h
# Opt level: O0

string * __thiscall
ObjectModelBuilder::uniqueIdentifier
          (string *__return_storage_ptr__,ObjectModelBuilder *this,Class *clazz,string *id)

{
  ulong uVar1;
  string local_80;
  allocator local_49;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *id_local;
  Class *clazz_local;
  ObjectModelBuilder *this_local;
  
  local_28 = id;
  id_local = &clazz->name;
  clazz_local = (Class *)this;
  this_local = (ObjectModelBuilder *)__return_storage_ptr__;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_28);
  }
  else {
    this->m_unnamedCounter = this->m_unnamedCounter + 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,"unnamable",&local_49);
    std::__cxx11::to_string(&local_80,this->m_unnamedCounter);
    std::operator+(__return_storage_ptr__,&local_48,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ObjectModelBuilder::uniqueIdentifier(Class *clazz, const std::string &id)
{
    if (id.empty()) {
        ++m_unnamedCounter;
        return std::string("unnamable") + std::to_string(m_unnamedCounter);
    }
    return id;
}